

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

void blowfish_expandkey(BlowfishContext *ctx,void *vkey,short keybytes,void *vsalt,short saltbytes)

{
  uint *puVar1;
  BlowfishContext *pBVar2;
  BlowfishContext *ctx_00;
  int iVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  uint32_t str [2];
  uchar dummysalt [1];
  uint32_t *S0;
  undefined8 local_48;
  undefined1 local_39;
  BlowfishContext *local_38;
  
  local_38 = ctx;
  if (vsalt == (void *)0x0) {
    vsalt = &local_39;
    local_39 = 0;
    saltbytes = 1;
  }
  lVar5 = 0;
  do {
    uVar6 = (uint)*(byte *)((long)vkey + (ulong)(ushort)((short)lVar5 % keybytes)) << 0x18 ^
            *(uint *)((long)ctx->P + lVar5);
    *(uint *)((long)ctx->P + lVar5) = uVar6;
    iVar7 = (int)lVar5;
    uVar6 = (uint)*(byte *)((long)vkey +
                           (ulong)(ushort)((int)((uint)(ushort)((short)(iVar7 + 1U) >> 0xf) << 0x10
                                                | iVar7 + 1U & 0xffff) % (int)keybytes)) << 0x10 ^
            uVar6;
    *(uint *)((long)ctx->P + lVar5) = uVar6;
    uVar6 = (uint)*(byte *)((long)vkey +
                           (ulong)(ushort)((int)((uint)(ushort)((short)(iVar7 + 2U) >> 0xf) << 0x10
                                                | iVar7 + 2U & 0xffff) % (int)keybytes)) << 8 ^
            uVar6;
    *(uint *)((long)ctx->P + lVar5) = uVar6;
    *(uint *)((long)ctx->P + lVar5) =
         *(byte *)((long)vkey +
                  (ulong)(ushort)((int)((uint)(ushort)((short)(iVar7 + 3U) >> 0xf) << 0x10 |
                                       iVar7 + 3U & 0xffff) % (int)keybytes)) ^ uVar6;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x48);
  local_48 = 0;
  iVar3 = (int)saltbytes;
  uVar9 = 0;
  iVar7 = 0;
  do {
    iVar8 = iVar7;
    bVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (uint *)((long)&local_48 + (ulong)(uVar6 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(uVar6 + iVar8) % iVar3)) <<
                          (~bVar4 & 0x18);
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar6 != 8);
    blowfish_encrypt((uint32_t)local_48,local_48._4_4_,(uint32_t *)&local_48,local_38);
    *(undefined8 *)(ctx->P + uVar9) = local_48;
    bVar10 = uVar9 < 0x10;
    uVar9 = uVar9 + 2;
    iVar7 = iVar8 + 8;
  } while (bVar10);
  uVar9 = 0;
  do {
    iVar7 = iVar8;
    iVar8 = iVar7 + 8;
    bVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (uint *)((long)&local_48 + (ulong)(uVar6 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar8 + uVar6) % iVar3)) <<
                          (~bVar4 & 0x18);
      pBVar2 = local_38;
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar6 != 8);
    blowfish_encrypt((uint32_t)local_48,local_48._4_4_,(uint32_t *)&local_48,local_38);
    *(undefined8 *)(pBVar2->S0 + uVar9) = local_48;
    bVar10 = uVar9 < 0xfe;
    uVar9 = uVar9 + 2;
  } while (bVar10);
  uVar9 = 0;
  iVar7 = iVar7 + 0x10;
  do {
    iVar8 = iVar7;
    bVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (uint *)((long)&local_48 + (ulong)(uVar6 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(uVar6 + iVar8) % iVar3)) <<
                          (~bVar4 & 0x18);
      pBVar2 = local_38;
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar6 != 8);
    blowfish_encrypt((uint32_t)local_48,local_48._4_4_,(uint32_t *)&local_48,local_38);
    *(undefined8 *)(pBVar2->S1 + uVar9) = local_48;
    bVar10 = uVar9 < 0xfe;
    uVar9 = uVar9 + 2;
    iVar7 = iVar8 + 8;
  } while (bVar10);
  uVar9 = 0;
  do {
    iVar7 = iVar8;
    iVar8 = iVar7 + 8;
    bVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (uint *)((long)&local_48 + (ulong)(uVar6 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar8 + uVar6) % iVar3)) <<
                          (~bVar4 & 0x18);
      pBVar2 = local_38;
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar6 != 8);
    blowfish_encrypt((uint32_t)local_48,local_48._4_4_,(uint32_t *)&local_48,local_38);
    ctx_00 = local_38;
    *(undefined8 *)(pBVar2->S2 + uVar9) = local_48;
    bVar10 = uVar9 < 0xfe;
    uVar9 = uVar9 + 2;
  } while (bVar10);
  iVar7 = iVar7 + 0x10;
  uVar9 = 0;
  do {
    bVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (uint *)((long)&local_48 + (ulong)(uVar6 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar7 + uVar6) % iVar3)) <<
                          (~bVar4 & 0x18);
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar6 != 8);
    blowfish_encrypt((uint32_t)local_48,local_48._4_4_,(uint32_t *)&local_48,ctx_00);
    *(undefined8 *)(ctx_00->S3 + uVar9) = local_48;
    iVar7 = iVar7 + 8;
    bVar10 = uVar9 < 0xfe;
    uVar9 = uVar9 + 2;
  } while (bVar10);
  return;
}

Assistant:

void blowfish_expandkey(BlowfishContext * ctx,
                        const void *vkey, short keybytes,
                        const void *vsalt, short saltbytes)
{
    const unsigned char *key = (const unsigned char *)vkey;
    const unsigned char *salt = (const unsigned char *)vsalt;
    uint32_t *S0 = ctx->S0;
    uint32_t *S1 = ctx->S1;
    uint32_t *S2 = ctx->S2;
    uint32_t *S3 = ctx->S3;
    uint32_t *P = ctx->P;
    uint32_t str[2];
    int i, j;
    int saltpos;
    unsigned char dummysalt[1];

    saltpos = 0;
    if (!salt) {
        saltbytes = 1;
        salt = dummysalt;
        dummysalt[0] = 0;
    }

    for (i = 0; i < 18; i++) {
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 0) % keybytes])) << 24;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 1) % keybytes])) << 16;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 2) % keybytes])) << 8;
        P[i] ^= ((uint32_t) (unsigned char) (key[(i * 4 + 3) % keybytes]));
    }

    str[0] = str[1] = 0;

    for (i = 0; i < 18; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));

        blowfish_encrypt(str[0], str[1], str, ctx);
        P[i] = str[0];
        P[i + 1] = str[1];
    }

    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S0[i] = str[0];
        S0[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S1[i] = str[0];
        S1[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S2[i] = str[0];
        S2[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S3[i] = str[0];
        S3[i + 1] = str[1];
    }
}